

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDVertex * __thiscall
ON_SubDEdgePtr::RelativeVertex(ON_SubDEdgePtr *this,int relative_vertex_index)

{
  ulong uVar1;
  ON_SubDEdge *edge;
  int relative_vertex_index_local;
  ON_SubDEdgePtr *this_local;
  
  if (((relative_vertex_index < 0) || (1 < relative_vertex_index)) ||
     (uVar1 = this->m_ptr & 0xfffffffffffffff8, uVar1 == 0)) {
    this_local = (ON_SubDEdgePtr *)0x0;
  }
  else {
    edge._4_4_ = relative_vertex_index;
    if ((this->m_ptr & 1) != 0) {
      edge._4_4_ = 1 - relative_vertex_index;
    }
    this_local = *(ON_SubDEdgePtr **)(uVar1 + 0x80 + (long)edge._4_4_ * 8);
  }
  return (ON_SubDVertex *)this_local;
}

Assistant:

const class ON_SubDVertex* ON_SubDEdgePtr::RelativeVertex(
  int relative_vertex_index
  ) const
{
  for (;;)
  {
    if (relative_vertex_index < 0 || relative_vertex_index>1)
      break;
    const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(m_ptr);
    if (nullptr == edge)
      break;
    if (0 != ON_SUBD_EDGE_DIRECTION(m_ptr))
      relative_vertex_index = 1 - relative_vertex_index;
    return edge->m_vertex[relative_vertex_index];
  }
  return nullptr;
}